

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_15c76d4::AV1FwdTxfm2d::SetUp(AV1FwdTxfm2d *this)

{
  int iVar1;
  int iVar2;
  ParamType *pPVar3;
  int16_t *piVar4;
  int32_t *piVar5;
  double *pdVar6;
  SEARCH_METHODS *pSVar7;
  double dVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  TXFM_2D_FLIP_CFG fwd_txfm_flip_cfg;
  
  pPVar3 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->tx_type_ =
       (pPVar3->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.field_0x11;
  pPVar3 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->tx_size_ =
       (pPVar3->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.
       super__Head_base<1UL,_unsigned_char,_false>._M_head_impl;
  pPVar3 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->max_error_ =
       (pPVar3->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.super__Tuple_impl<2UL,_double,_double>.
       super__Head_base<2UL,_double,_false>._M_head_impl;
  pPVar3 = testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
           GetParam();
  this->max_avg_error_ =
       (pPVar3->super__Tuple_impl<0UL,_unsigned_char,_unsigned_char,_double,_double>).
       super__Tuple_impl<1UL,_unsigned_char,_double,_double>.super__Tuple_impl<2UL,_double,_double>.
       super__Tuple_impl<3UL,_double>.super__Head_base<3UL,_double,_false>._M_head_impl;
  this->count_ = 500;
  av1_get_fwd_txfm_cfg(this->tx_type_,this->tx_size_,&fwd_txfm_flip_cfg);
  dVar8 = libaom_test::get_amplification_factor(this->tx_type_,this->tx_size_);
  this->amplify_factor_ = dVar8;
  iVar1 = ::tx_size_wide[fwd_txfm_flip_cfg.tx_size];
  this->tx_width_ = iVar1;
  iVar2 = ::tx_size_high[fwd_txfm_flip_cfg.tx_size];
  this->tx_height_ = iVar2;
  this->ud_flip_ = fwd_txfm_flip_cfg.ud_flip;
  this->lr_flip_ = fwd_txfm_flip_cfg.lr_flip;
  this->fwd_txfm_ = *(FwdTxfm2dFunc *)(libaom_test::fwd_txfm_func_ls + (ulong)this->tx_size_ * 8);
  iVar2 = iVar2 * iVar1;
  this->txfm2d_size_ = iVar2;
  piVar4 = (int16_t *)aom_memalign(0x10,(long)iVar2 * 2);
  this->input_ = piVar4;
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<short*,decltype(nullptr)>
            ((internal *)&gtest_ar,"input_","nullptr",&this->input_,&local_70._M_head_impl);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar7 = "";
    }
    else {
      pSVar7 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
               ,0x3b,(char *)pSVar7);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    piVar5 = (int32_t *)aom_memalign(0x10,(long)this->txfm2d_size_ << 2);
    this->output_ = piVar5;
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<int*,decltype(nullptr)>
              ((internal *)&gtest_ar,"output_","nullptr",&this->output_,&local_70._M_head_impl);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar7 = "";
      }
      else {
        pSVar7 = *(SEARCH_METHODS **)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                 ,0x3e,(char *)pSVar7);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      pdVar6 = (double *)aom_memalign(0x10,(long)this->txfm2d_size_ << 3);
      this->ref_input_ = pdVar6;
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<double*,decltype(nullptr)>
                ((internal *)&gtest_ar,"ref_input_","nullptr",&this->ref_input_,
                 &local_70._M_head_impl);
      if (gtest_ar.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        pdVar6 = (double *)aom_memalign(0x10,(long)this->txfm2d_size_ << 3);
        this->ref_output_ = pdVar6;
        local_70._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<double*,decltype(nullptr)>
                  ((internal *)&gtest_ar,"ref_output_","nullptr",&this->ref_output_,
                   &local_70._M_head_impl);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_70);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar7 = "";
          }
          else {
            pSVar7 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                     ,0x44,(char *)pSVar7);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_70._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_70._M_head_impl + 8))();
          }
        }
        goto LAB_0062c426;
      }
      testing::Message::Message((Message *)&local_70);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar7 = "";
      }
      else {
        pSVar7 = *(SEARCH_METHODS **)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_fwd_txfm2d_test.cc"
                 ,0x41,(char *)pSVar7);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
LAB_0062c426:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void SetUp() override {
    tx_type_ = GET_PARAM(0);
    tx_size_ = GET_PARAM(1);
    max_error_ = GET_PARAM(2);
    max_avg_error_ = GET_PARAM(3);
    count_ = 500;
    TXFM_2D_FLIP_CFG fwd_txfm_flip_cfg;
    av1_get_fwd_txfm_cfg(tx_type_, tx_size_, &fwd_txfm_flip_cfg);
    amplify_factor_ = libaom_test::get_amplification_factor(tx_type_, tx_size_);
    tx_width_ = tx_size_wide[fwd_txfm_flip_cfg.tx_size];
    tx_height_ = tx_size_high[fwd_txfm_flip_cfg.tx_size];
    ud_flip_ = fwd_txfm_flip_cfg.ud_flip;
    lr_flip_ = fwd_txfm_flip_cfg.lr_flip;

    fwd_txfm_ = libaom_test::fwd_txfm_func_ls[tx_size_];
    txfm2d_size_ = tx_width_ * tx_height_;
    input_ = reinterpret_cast<int16_t *>(
        aom_memalign(16, sizeof(input_[0]) * txfm2d_size_));
    ASSERT_NE(input_, nullptr);
    output_ = reinterpret_cast<int32_t *>(
        aom_memalign(16, sizeof(output_[0]) * txfm2d_size_));
    ASSERT_NE(output_, nullptr);
    ref_input_ = reinterpret_cast<double *>(
        aom_memalign(16, sizeof(ref_input_[0]) * txfm2d_size_));
    ASSERT_NE(ref_input_, nullptr);
    ref_output_ = reinterpret_cast<double *>(
        aom_memalign(16, sizeof(ref_output_[0]) * txfm2d_size_));
    ASSERT_NE(ref_output_, nullptr);
  }